

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Read<signed_char> __thiscall Omega_h::mark_image(Omega_h *this,LOs *a2b,LO nb)

{
  int *piVar1;
  Alloc *pAVar2;
  long lVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  int iVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  Read<signed_char> RVar9;
  type f;
  Write<signed_char> out;
  string local_68;
  Write<signed_char> local_48;
  Write<signed_char> local_38;
  
  pAVar2 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar6 = pAVar2->size;
  }
  else {
    sVar6 = (ulong)pAVar2 >> 3;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Write<signed_char>::Write(&local_48,nb,'\0',&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)(a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68._M_dataplus._M_p = (pointer)(((Alloc *)local_68._M_dataplus._M_p)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_68._M_dataplus._M_p)->use_count =
           ((Alloc *)local_68._M_dataplus._M_p)->use_count + 1;
    }
  }
  local_68._M_string_length = (size_type)(a2b->write_).shared_alloc_.direct_ptr;
  local_68.field_2._M_allocated_capacity = (size_type)local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68.field_2._M_allocated_capacity = (local_48.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_48.shared_alloc_.alloc)->use_count = (local_48.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.field_2._8_8_ = local_48.shared_alloc_.direct_ptr;
  _Var7._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      _Var7._M_p = (pointer)(*(long *)local_68._M_dataplus._M_p * 8 + 1);
    }
    else {
      *(int *)(local_68._M_dataplus._M_p + 0x30) = *(int *)(local_68._M_dataplus._M_p + 0x30) + 1;
    }
  }
  uVar8 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      uVar8 = (Alloc *)(*(long *)local_68.field_2._M_allocated_capacity * 8 + 1);
    }
    else {
      *(int *)(local_68.field_2._M_allocated_capacity + 0x30) =
           *(int *)(local_68.field_2._M_allocated_capacity + 0x30) + 1;
    }
  }
  iVar5 = (int)(sVar6 >> 2);
  if (0 < iVar5) {
    if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
      ((Alloc *)_Var7._M_p)->use_count = ((Alloc *)_Var7._M_p)->use_count + -1;
      _Var7._M_p = (pointer)(((Alloc *)_Var7._M_p)->size * 8 + 1);
    }
    if ((uVar8 & 7) == 0 && (Alloc *)uVar8 != (Alloc *)0x0) {
      ((Alloc *)uVar8)->use_count = ((Alloc *)uVar8)->use_count + -1;
      uVar8 = ((Alloc *)uVar8)->size * 8 + 1;
    }
    entering_parallel = '\0';
    lVar3 = 0;
    do {
      *(undefined1 *)
       ((long)local_48.shared_alloc_.direct_ptr +
       (long)*(int *)(local_68._M_string_length + lVar3 * 4)) = 1;
      lVar3 = lVar3 + 1;
    } while (iVar5 != (int)lVar3);
    if ((uVar8 & 7) == 0 && (Alloc *)uVar8 != (Alloc *)0x0) {
      piVar1 = &((Alloc *)uVar8)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar8);
        operator_delete((void *)uVar8,0x48);
      }
    }
    if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
      piVar1 = &((Alloc *)_Var7._M_p)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)_Var7._M_p);
        operator_delete(_Var7._M_p,0x48);
      }
    }
    _Var7._M_p = (pointer)0x0;
    uVar8 = (Alloc *)0x0;
  }
  if ((uVar8 & 7) == 0 && (Alloc *)uVar8 != (Alloc *)0x0) {
    piVar1 = &((Alloc *)uVar8)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)uVar8);
      operator_delete((void *)uVar8,0x48);
    }
  }
  if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
    piVar1 = &((Alloc *)_Var7._M_p)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)_Var7._M_p);
      operator_delete(_Var7._M_p,0x48);
    }
  }
  local_38.shared_alloc_.alloc = local_48.shared_alloc_.alloc;
  local_38.shared_alloc_.direct_ptr = local_48.shared_alloc_.direct_ptr;
  if ((((ulong)local_48.shared_alloc_.alloc & 7) == 0 &&
       local_48.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_48.shared_alloc_.alloc)->use_count = (local_48.shared_alloc_.alloc)->use_count + -1;
    local_38.shared_alloc_.alloc = (Alloc *)((local_48.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_48.shared_alloc_.alloc = (Alloc *)0x0;
  local_48.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_38);
  pAVar2 = local_38.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 && local_38.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  uVar8 = local_68.field_2._M_allocated_capacity;
  if ((local_68.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_68.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_68.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68.field_2._M_allocated_capacity);
      operator_delete((void *)uVar8,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  _Var7._M_p = local_68._M_dataplus._M_p;
  if (((ulong)local_68._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_68._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_68._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_68._M_dataplus._M_p);
      operator_delete(_Var7._M_p,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar2 = local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_48.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_image(LOs a2b, LO nb) {
  auto na = a2b.size();
  Write<I8> out(nb, 0);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    out[b] = 1;
  };
  parallel_for(na, f, "mark_image");
  return out;
}